

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall
restincurl::RequestBuilder::Prepare(RequestBuilder *this,RequestType rt,string *url)

{
  string *url_local;
  RequestType rt_local;
  RequestBuilder *this_local;
  
  if (this->request_type_ != INVALID) {
    __assert_fail("request_type_ == RequestType::INVALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x48e,
                  "RequestBuilder &restincurl::RequestBuilder::Prepare(RequestType, const std::string &)"
                 );
  }
  if (((this->is_built_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_built_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x48f,
                  "RequestBuilder &restincurl::RequestBuilder::Prepare(RequestType, const std::string &)"
                 );
  }
  this->request_type_ = rt;
  std::__cxx11::string::operator=((string *)&this->url_,(string *)url);
  return this;
}

Assistant:

RequestBuilder& Prepare(RequestType rt, const std::string& url) {
            assert(request_type_ == RequestType::INVALID);
            assert(!is_built_);
            request_type_  = rt;
            url_ = url;
            return *this;
        }